

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O1

Vec_Int_t * Abc_NtkRetimeInitialValues(Abc_Ntk_t *pNtkCone,Vec_Int_t *vValues,int fVerbose)

{
  Abc_Obj_t *pObj;
  long *plVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int level;
  Abc_Ntk_t *pAVar12;
  char *__s;
  ulong uVar13;
  timespec ts;
  timespec local_48;
  Vec_Int_t *local_38;
  
  if (pNtkCone == (Abc_Ntk_t *)0x0) {
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar2 = vValues->nSize;
    lVar9 = (long)iVar2;
    pVVar7->nSize = iVar2;
    pVVar7->nCap = iVar2;
    if (lVar9 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc(lVar9 * 4);
    }
    pVVar7->pArray = piVar4;
    memcpy(piVar4,vValues->pArray,lVar9 << 2);
    return pVVar7;
  }
  pNtk = Abc_NtkDup(pNtkCone);
  Abc_NtkToAig(pNtk);
  pNtk_00 = Abc_NtkCreateTarget(pNtk,pNtk->vCos,vValues);
  if (fVerbose != 0) {
    printf("The miter for initial state computation has %d AIG nodes. ",
           (ulong)(uint)pNtk_00->nObjCounts[7]);
  }
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pAVar12 = pNtk_00;
  iVar2 = Abc_NtkMiterSat(pNtk_00,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
  if (fVerbose != 0) {
    Abc_Print((int)pAVar12,"%s =","SAT solving time");
    level = 3;
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar10 + lVar9) / 1000000.0);
  }
  if (iVar2 == -1) {
    __s = "Abc_NtkRetimeInitialValues(): The SAT problem timed out. DC latch values are used.";
  }
  else {
    if (iVar2 != 1) {
      if ((pNtkCone->ntkFunc != ABC_FUNC_SOP) || (pNtkCone->ntkType != ABC_NTK_LOGIC)) {
        __assert_fail("Abc_NtkIsSopLogic(pNtkCone)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retInit.c"
                      ,0x8a,"int Abc_NtkRetimeVerifyModel(Abc_Ntk_t *, Vec_Int_t *, int *)");
      }
      pVVar5 = pNtkCone->vPis;
      if (0 < pVVar5->nSize) {
        piVar4 = pNtk_00->pModel;
        lVar9 = 0;
        do {
          *(long *)((long)pVVar5->pArray[lVar9] + 0x40) = (long)piVar4[lVar9];
          lVar9 = lVar9 + 1;
          pVVar5 = pNtkCone->vPis;
        } while (lVar9 < pVVar5->nSize);
      }
      local_38 = vValues;
      pVVar5 = Abc_NtkDfs(pNtkCone,0);
      if (0 < pVVar5->nSize) {
        lVar9 = 0;
        do {
          pObj = (Abc_Obj_t *)pVVar5->pArray[lVar9];
          aVar6._0_4_ = Abc_ObjSopSimulate(pObj);
          aVar6._4_4_ = 0;
          pObj->field_6 = aVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar5->nSize);
      }
      if (pVVar5->pArray != (void **)0x0) {
        free(pVVar5->pArray);
        pVVar5->pArray = (void **)0x0;
      }
      pVVar7 = local_38;
      if (pVVar5 != (Vec_Ptr_t *)0x0) {
        free(pVVar5);
      }
      pVVar5 = pNtkCone->vPos;
      uVar11 = (ulong)(uint)pVVar5->nSize;
      if (0 < pVVar5->nSize) {
        lVar9 = 0;
        do {
          plVar1 = (long *)pVVar5->pArray[lVar9];
          plVar1[8] = *(long *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                         (long)*(int *)plVar1[4] * 8) + 0x40);
          lVar9 = lVar9 + 1;
          pVVar5 = pNtkCone->vPos;
          uVar11 = (ulong)pVVar5->nSize;
        } while (lVar9 < (long)uVar11);
      }
      if ((int)uVar11 < 1) {
        iVar3 = 0;
      }
      else {
        uVar8 = pVVar7->nSize;
        iVar3 = 0;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        if (uVar8 <= (int)uVar11 - 1U) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar13 = 0;
        do {
          iVar3 = iVar3 + (uint)(pVVar7->pArray[uVar13] !=
                                *(int *)((long)pVVar5->pArray[uVar13] + 0x40));
          uVar13 = uVar13 + 1;
        } while ((uVar11 & 0xffffffff) != uVar13);
      }
      if (iVar3 != 0) {
        printf("%d outputs (out of %d) have a value mismatch.\n");
      }
      goto LAB_004cc837;
    }
    __s = "Abc_NtkRetimeInitialValues(): The problem is unsatisfiable. DC latch values are used.";
  }
  puts(__s);
LAB_004cc837:
  if (iVar2 == 0) {
    piVar4 = pNtk_00->pModel;
    iVar2 = pNtk->vPis->nSize;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nSize = iVar2;
    pVVar7->nCap = iVar2;
    pVVar7->pArray = piVar4;
  }
  else {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  pNtk_00->pModel = (int *)0x0;
  Abc_NtkDelete(pNtk_00);
  Abc_NtkDelete(pNtk);
  return pVVar7;
}

Assistant:

Vec_Int_t * Abc_NtkRetimeInitialValues( Abc_Ntk_t * pNtkCone, Vec_Int_t * vValues, int fVerbose )
{
    Vec_Int_t * vSolution;
    Abc_Ntk_t * pNtkMiter, * pNtkLogic;
    int RetValue;
    abctime clk;
    if ( pNtkCone == NULL )
        return Vec_IntDup( vValues );
    // convert the target network to AIG
    pNtkLogic = Abc_NtkDup( pNtkCone );
    Abc_NtkToAig( pNtkLogic );
    // get the miter
    pNtkMiter = Abc_NtkCreateTarget( pNtkLogic, pNtkLogic->vCos, vValues );
    if ( fVerbose )
        printf( "The miter for initial state computation has %d AIG nodes. ", Abc_NtkNodeNum(pNtkMiter) );
    // solve the miter
    clk = Abc_Clock();
    RetValue = Abc_NtkMiterSat( pNtkMiter, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );
    if ( fVerbose ) 
        { ABC_PRT( "SAT solving time", Abc_Clock() - clk ); }
    // analyze the result
    if ( RetValue == 1 )
        printf( "Abc_NtkRetimeInitialValues(): The problem is unsatisfiable. DC latch values are used.\n" );
    else if ( RetValue == -1 )
        printf( "Abc_NtkRetimeInitialValues(): The SAT problem timed out. DC latch values are used.\n" );
    else if ( !Abc_NtkRetimeVerifyModel( pNtkCone, vValues, pNtkMiter->pModel ) )
        printf( "Abc_NtkRetimeInitialValues(): The computed counter-example is incorrect.\n" );
    // set the values of the latches
    vSolution = RetValue? NULL : Vec_IntAllocArray( pNtkMiter->pModel, Abc_NtkPiNum(pNtkLogic) );
    pNtkMiter->pModel = NULL;
    Abc_NtkDelete( pNtkMiter );
    Abc_NtkDelete( pNtkLogic );
    return vSolution;
}